

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O0

void transform_reg_to_var(List *code,Token *to_replace,char *var_name)

{
  BOOL BVar1;
  char *var_name_local;
  Token *to_replace_local;
  List *code_local;
  
  if (code != (List *)0x0) {
    BVar1 = tokens_equal(&code->token,to_replace);
    if (BVar1 != FALSE) {
      (code->token).type = TOK_QUOTED_STRING;
      (code->token).u.string = var_name;
    }
    transform_reg_to_var(code->car,to_replace,var_name);
    transform_reg_to_var(code->cdr,to_replace,var_name);
  }
  return;
}

Assistant:

static void
transform_reg_to_var (List *code, Token *to_replace, const char *var_name)
{
  /* Recursion base case. */
  if (code == NULL)
    return;

  /* If this is the appropriate temp register, replace it. */
  if (tokens_equal (&code->token, to_replace))
    {
      code->token.type = TOK_QUOTED_STRING;
      code->token.u.string = var_name;
    }

  /* Recurse. */
  transform_reg_to_var (code->car, to_replace, var_name);
  transform_reg_to_var (code->cdr, to_replace, var_name);
}